

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

COMPONENT_TYPE Diligent::ValueTypeToComponentType(VALUE_TYPE ValType,bool IsNormalized,bool IsSRGB)

{
  Char *Message;
  char local_4e;
  char local_4c;
  char local_4b;
  char local_49;
  undefined1 local_30 [8];
  string msg;
  bool IsSRGB_local;
  bool IsNormalized_local;
  VALUE_TYPE ValType_local;
  
  switch(ValType) {
  case VT_UNDEFINED:
    msg.field_2._M_local_buf[0xf] = '\0';
    break;
  case VT_INT8:
  case VT_INT16:
    local_4e = '\x02';
    if (!IsNormalized) {
      local_4e = '\x05';
    }
    msg.field_2._M_local_buf[0xf] = local_4e;
    break;
  case VT_INT32:
    msg.field_2._M_local_buf[0xf] = '\x05';
    break;
  case VT_UINT8:
    if (IsNormalized) {
      local_49 = '\x04';
      if (!IsSRGB) {
        local_49 = '\x03';
      }
      local_4b = local_49;
    }
    else {
      local_4b = '\x06';
    }
    msg.field_2._M_local_buf[0xf] = local_4b;
    break;
  case VT_UINT16:
    local_4c = '\x03';
    if (!IsNormalized) {
      local_4c = '\x06';
    }
    msg.field_2._M_local_buf[0xf] = local_4c;
    break;
  case VT_UINT32:
    msg.field_2._M_local_buf[0xf] = '\x06';
    break;
  case VT_FLOAT16:
  case VT_FLOAT32:
  case VT_FLOAT64:
    msg.field_2._M_local_buf[0xf] = '\x01';
    break;
  default:
    msg.field_2._M_local_buf[0xc] = IsSRGB;
    msg.field_2._M_local_buf[0xd] = IsNormalized;
    msg.field_2._M_local_buf[0xe] = ValType;
    FormatString<char[19]>((string *)local_30,(char (*) [19])"Unknown value type");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"ValueTypeToComponentType",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x1e1);
    std::__cxx11::string::~string((string *)local_30);
    msg.field_2._M_local_buf[0xf] = '\0';
  }
  return msg.field_2._M_local_buf[0xf];
}

Assistant:

COMPONENT_TYPE ValueTypeToComponentType(VALUE_TYPE ValType, bool IsNormalized, bool IsSRGB)
{
    static_assert(VT_NUM_TYPES == 10, "Please handle the new value type below");
    switch (ValType)
    {
        case VT_UNDEFINED: return COMPONENT_TYPE_UNDEFINED;

        case VT_UINT8:
            return IsNormalized ? (IsSRGB ? COMPONENT_TYPE_UNORM_SRGB : COMPONENT_TYPE_UNORM) : COMPONENT_TYPE_UINT;

        case VT_UINT16:
            return IsNormalized ? COMPONENT_TYPE_UNORM : COMPONENT_TYPE_UINT;

        case VT_INT8:
        case VT_INT16:
            return IsNormalized ? COMPONENT_TYPE_SNORM : COMPONENT_TYPE_SINT;

        case VT_INT32:
            return COMPONENT_TYPE_SINT;

        case VT_UINT32:
            return COMPONENT_TYPE_UINT;

        case VT_FLOAT16:
        case VT_FLOAT32:
        case VT_FLOAT64:
            return COMPONENT_TYPE_FLOAT;

        default:
            UNEXPECTED("Unknown value type");
            return COMPONENT_TYPE_UNDEFINED;
    }
}